

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O3

Vec_Ptr_t * Aig_ManSupportsRegisters(Aig_Man_t *p)

{
  uint uVar1;
  int iVar2;
  void **__ptr;
  void *__ptr_00;
  void *__ptr_01;
  uint uVar3;
  Vec_Ptr_t *__ptr_02;
  Vec_Ptr_t *pVVar4;
  void **__s;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  
  __ptr_02 = Aig_ManSupports(p);
  uVar1 = p->nRegs;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  uVar3 = 8;
  if (6 < uVar1 - 1) {
    uVar3 = uVar1;
  }
  pVVar4->nCap = uVar3;
  if (uVar3 == 0) {
    __s = (void **)0x0;
  }
  else {
    __s = (void **)malloc((long)(int)uVar3 << 3);
  }
  pVVar4->pArray = __s;
  pVVar4->nSize = uVar1;
  memset(__s,0,(long)(int)uVar1 << 3);
  iVar2 = __ptr_02->nSize;
  __ptr = __ptr_02->pArray;
  if (0 < (long)iVar2) {
    lVar10 = 0;
    do {
      __ptr_00 = __ptr[lVar10];
      iVar12 = *(int *)((long)__ptr_00 + 4);
      if (iVar12 < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x396,"int Vec_IntPop(Vec_Int_t *)");
      }
      __ptr_01 = *(void **)((long)__ptr_00 + 8);
      uVar5 = (ulong)(iVar12 - 1U);
      *(uint *)((long)__ptr_00 + 4) = iVar12 - 1U;
      uVar3 = (p->nRegs - p->nObjs[3]) + *(int *)((long)__ptr_01 + uVar5 * 4);
      if ((int)uVar3 < 0) {
        free(__ptr_01);
        free(__ptr_00);
      }
      else {
        iVar6 = 0;
        if (iVar12 != 1) {
          lVar11 = 0;
          uVar8 = 0;
          do {
            iVar12 = (p->nRegs - p->nObjs[2]) + *(int *)((long)__ptr_01 + lVar11 * 4);
            uVar9 = uVar8;
            if (-1 < iVar12) {
              if (p->nRegs <= iVar12) {
                __assert_fail("iIn < Aig_ManRegNum(p)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigPart.c"
                              ,0x1bc,"Vec_Ptr_t *Aig_ManSupportsRegisters(Aig_Man_t *)");
              }
              uVar7 = (uint)uVar8;
              if (((int)uVar7 < 0) || ((uint)uVar5 <= uVar7)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                              ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              uVar9 = (ulong)(uVar7 + 1);
              *(int *)((long)__ptr_01 + uVar8 * 4) = iVar12;
              uVar5 = (ulong)*(uint *)((long)__ptr_00 + 4);
            }
            iVar6 = (int)uVar9;
            lVar11 = lVar11 + 1;
            uVar8 = uVar9;
          } while (lVar11 < (int)uVar5);
          if ((int)uVar5 < iVar6) {
            __assert_fail("p->nSize >= nSizeNew",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x2ac,"void Vec_IntShrink(Vec_Int_t *, int)");
          }
        }
        *(int *)((long)__ptr_00 + 4) = iVar6;
        if (p->nRegs <= (int)uVar3) {
          __assert_fail("iOut < Aig_ManRegNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigPart.c"
                        ,0x1c1,"Vec_Ptr_t *Aig_ManSupportsRegisters(Aig_Man_t *)");
        }
        if ((int)uVar1 <= (int)uVar3) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
        }
        __s[uVar3] = __ptr_00;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != iVar2);
  }
  if (__ptr != (void **)0x0) {
    free(__ptr);
  }
  free(__ptr_02);
  if (0 < (int)uVar1) {
    uVar5 = 0;
    do {
      if (__s[uVar5] == (void *)0x0) {
        __assert_fail("vSupp != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigPart.c"
                      ,0x1c7,"Vec_Ptr_t *Aig_ManSupportsRegisters(Aig_Man_t *)");
      }
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
  }
  return pVVar4;
}

Assistant:

Vec_Ptr_t * Aig_ManSupportsRegisters( Aig_Man_t * p )
{
    Vec_Ptr_t * vSupports, * vMatrix;
    Vec_Int_t * vSupp;
    int iOut, iIn, k, m, i;
    // get structural supports for each output
    vSupports = Aig_ManSupports( p );
    // transforms the supports into the latch dependency matrix
    vMatrix = Vec_PtrStart( Aig_ManRegNum(p) );
    Vec_PtrForEachEntry( Vec_Int_t *, vSupports, vSupp, i )
    {
        // skip true POs
        iOut = Vec_IntPop( vSupp );
        iOut -= Aig_ManCoNum(p) - Aig_ManRegNum(p);
        if ( iOut < 0 )
        {
            Vec_IntFree( vSupp );
            continue;
        }
        // remove PIs
        m = 0;
        Vec_IntForEachEntry( vSupp, iIn, k )
        {
            iIn -= Aig_ManCiNum(p) - Aig_ManRegNum(p);
            if ( iIn < 0 )
                continue;
            assert( iIn < Aig_ManRegNum(p) );
            Vec_IntWriteEntry( vSupp, m++, iIn );
        }
        Vec_IntShrink( vSupp, m );
        // store support in the matrix
        assert( iOut < Aig_ManRegNum(p) );
        Vec_PtrWriteEntry( vMatrix, iOut, vSupp );
    }
    Vec_PtrFree( vSupports );
    // check that all supports are used
    Vec_PtrForEachEntry( Vec_Int_t *, vMatrix, vSupp, i )
        assert( vSupp != NULL );
    return vMatrix;
}